

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convenience_socket_bases.cpp
# Opt level: O1

void __thiscall
tlm_utils::convenience_socket_base::display_warning(convenience_socket_base *this,char *text)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  stringstream s;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  long local_198 [47];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  lVar2 = (**(code **)(*(long *)this + 0x18))(this);
  pcVar4 = *(char **)(lVar2 + 0x40);
  iVar1 = (int)(ostream *)local_198;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  if (text == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,text,sVar3);
  }
  pcVar4 = (char *)(**(code **)(*(long *)this + 0x10))(this);
  std::__cxx11::stringbuf::str();
  sc_core::sc_report_handler::report
            (SC_WARNING,pcVar4,local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/tlm_utils/convenience_socket_bases.cpp"
             ,0x22);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void
convenience_socket_base::display_warning(const char* text) const
{
  std::stringstream s;
  s << get_socket()->name() << ": " << text;
  SC_REPORT_WARNING(get_report_type(), s.str().c_str());
}